

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

int __thiscall google::protobuf::io::CopyingInputStream::Skip(CopyingInputStream *this,int count)

{
  int *piVar1;
  int in_ESI;
  long *in_RDI;
  int bytes;
  int skipped;
  char junk [4096];
  unsigned_long local_1030;
  int local_1028;
  int local_1024;
  int local_1020;
  int local_101c;
  undefined1 local_1018 [4100];
  int local_14;
  
  local_101c = 0;
  local_14 = in_ESI;
  while( true ) {
    if (local_14 <= local_101c) {
      return local_101c;
    }
    local_1024 = local_14 - local_101c;
    local_1030 = 0x1000;
    local_1028 = internal::implicit_cast<int,unsigned_long>(&local_1030);
    piVar1 = std::min<int>(&local_1024,&local_1028);
    local_1020 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_1018,*piVar1);
    if (local_1020 < 1) break;
    local_101c = local_1020 + local_101c;
  }
  return local_101c;
}

Assistant:

int CopyingInputStream::Skip(int count) {
  char junk[4096];
  int skipped = 0;
  while (skipped < count) {
    int bytes = Read(junk, std::min(count - skipped,
                                    implicit_cast<int>(sizeof(junk))));
    if (bytes <= 0) {
      // EOF or read error.
      return skipped;
    }
    skipped += bytes;
  }
  return skipped;
}